

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyncRegister.cpp
# Opt level: O0

void __thiscall
SyncRegister::SyncRegister
          (SyncRegister *this,BoxArray *fine_boxes,DistributionMapping *dmap,IntVect *ref_ratio)

{
  undefined8 *in_RCX;
  undefined8 *in_RDI;
  BoxArray hiBA;
  BoxArray loBA;
  BndryBATransformer hitrans;
  BndryBATransformer lotrans;
  Orientation hiface;
  Orientation loface;
  int dir;
  undefined4 in_stack_fffffffffffffdf8;
  int in_stack_fffffffffffffdfc;
  int in_stack_fffffffffffffe00;
  int in_stack_fffffffffffffe04;
  undefined4 in_stack_fffffffffffffe08;
  undefined4 in_stack_fffffffffffffe0c;
  undefined4 in_stack_fffffffffffffe10;
  IndexType t;
  undefined4 in_stack_fffffffffffffe14;
  Orientation f;
  IntVect *iv;
  BoxArray *this_00;
  BATransformer *in_stack_fffffffffffffe58;
  BoxArray *in_stack_fffffffffffffe60;
  undefined4 in_stack_fffffffffffffe68;
  int in_stack_fffffffffffffe6c;
  DistributionMapping *in_stack_fffffffffffffe70;
  BoxArray *in_stack_fffffffffffffe78;
  FabSet *in_stack_fffffffffffffe80;
  Orientation local_40;
  Orientation local_3c;
  int local_38;
  undefined8 *local_28;
  IndexType local_8;
  IndexType local_4;
  
  local_28 = in_RCX;
  amrex::BndryRegister::BndryRegister
            ((BndryRegister *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10));
  *in_RDI = &PTR__SyncRegister_01aa2bc0;
  this_00 = (BoxArray *)(in_RDI + 0x12e);
  iv = (IntVect *)(in_RDI + 0x24e);
  do {
    amrex::FabSet::FabSet((FabSet *)0x72af2a);
    this_00 = (BoxArray *)((long)this_00 + 0x180);
  } while (this_00 != (BoxArray *)iv);
  *(undefined4 *)(in_RDI + 0x24f) = *(undefined4 *)(local_28 + 1);
  in_RDI[0x24e] = *local_28;
  amrex::BoxArray::operator=
            ((BoxArray *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
             (BoxArray *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
  amrex::BoxArray::coarsen(this_00,iv);
  for (local_38 = 0; local_38 < 3; local_38 = local_38 + 1) {
    f.val = 0;
    amrex::Orientation::Orientation(&local_3c,local_38,low);
    t.itype = NODE;
    amrex::Orientation::Orientation(&local_40,local_38,high);
    amrex::IndexType::IndexType(&local_4,t.itype,t.itype,t.itype);
    amrex::BATransformer::BATransformer
              ((BATransformer *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08),f,t,
               in_stack_fffffffffffffe04,in_stack_fffffffffffffe00,in_stack_fffffffffffffdfc);
    in_stack_fffffffffffffe0c = 1;
    amrex::IndexType::IndexType(&local_8,NODE,NODE,NODE);
    amrex::BATransformer::BATransformer
              ((BATransformer *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08),f,t,
               in_stack_fffffffffffffe04,in_stack_fffffffffffffe00,in_stack_fffffffffffffdfc);
    amrex::BoxArray::BoxArray
              ((BoxArray *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
               in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
    amrex::BoxArray::BoxArray
              ((BoxArray *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
               in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
    amrex::Orientation::operator_cast_to_int(&local_3c);
    amrex::FabSet::define
              (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,in_stack_fffffffffffffe70,
               in_stack_fffffffffffffe6c);
    amrex::Orientation::operator_cast_to_int(&local_3c);
    amrex::FabSet::define
              (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,in_stack_fffffffffffffe70,
               in_stack_fffffffffffffe6c);
    amrex::Orientation::operator_cast_to_int(&local_40);
    amrex::FabSet::define
              (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,in_stack_fffffffffffffe70,
               in_stack_fffffffffffffe6c);
    amrex::Orientation::operator_cast_to_int(&local_40);
    amrex::FabSet::define
              (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,in_stack_fffffffffffffe70,
               in_stack_fffffffffffffe6c);
    amrex::BoxArray::~BoxArray
              ((BoxArray *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00));
    amrex::BoxArray::~BoxArray
              ((BoxArray *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00));
  }
  return;
}

Assistant:

SyncRegister::SyncRegister (const BoxArray& fine_boxes,
                            const DistributionMapping& dmap,
                            const IntVect&  ref_ratio)
    : ratio(ref_ratio)
{
    BL_ASSERT(grids.size() == 0);
    BL_ASSERT(fine_boxes.isDisjoint());

    grids = fine_boxes;
    grids.coarsen(ratio);

    for (int dir = 0; dir < AMREX_SPACEDIM; dir++)
    {
        Orientation loface(dir, Orientation::low);
        Orientation hiface(dir, Orientation::high);

        BndryBATransformer lotrans(loface, IndexType::TheNodeType(), 0, 1, 0);
        BndryBATransformer hitrans(hiface, IndexType::TheNodeType(), 0, 1, 0);

        BoxArray loBA(grids, lotrans);
        BoxArray hiBA(grids, hitrans);

        bndry[loface].define(loBA,dmap,1);
        bndry_mask[loface].define(loBA,dmap,1);
        bndry[hiface].define(hiBA,dmap,1);
        bndry_mask[hiface].define(hiBA,dmap,1);
    }
}